

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

void __thiscall pm::World::World(World *this)

{
  unique_ptr<pm::Ambient,_std::default_delete<pm::Ambient>_> local_18;
  World *local_10;
  World *this_local;
  
  local_10 = this;
  ViewPlane::ViewPlane(&this->viewplane_);
  RGBColor::RGBColor(&this->background_,0.0,0.0,0.0);
  std::
  vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  ::vector(&this->objects_);
  std::
  vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ::vector(&this->materials_);
  std::make_unique<pm::Ambient,float>((float *)&local_18);
  std::unique_ptr<pm::Light,std::default_delete<pm::Light>>::
  unique_ptr<pm::Ambient,std::default_delete<pm::Ambient>,void>
            ((unique_ptr<pm::Light,std::default_delete<pm::Light>> *)&this->ambientLight_,&local_18)
  ;
  std::unique_ptr<pm::Ambient,_std::default_delete<pm::Ambient>_>::~unique_ptr(&local_18);
  std::
  vector<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  ::vector(&this->lights_);
  std::
  vector<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ::vector(&this->samplers_);
  return;
}

Assistant:

World::World()
    : background_(0.0f, 0.0f, 0.0f),
      ambientLight_(std::make_unique<Ambient>(0.0f))
{
}